

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::createIndexBuffer
          (DrawCallBatchingTest *this)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  reference pvVar5;
  GLuint local_2c;
  GLuint local_28;
  GLuint buffer_3;
  GLuint buffer_2;
  GLuint buffer_1;
  GLuint buffer;
  int drawNdx;
  Functions *gl;
  DrawCallBatchingTest *this_local;
  
  gl = (Functions *)this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  _buffer = CONCAT44(extraout_var,iVar3);
  if (((this->m_spec).dynamicIndices & 1U) == 0) {
    (**(code **)(_buffer + 0x6c8))(1,&local_28);
    (**(code **)(_buffer + 0x40))(0x8893,local_28);
    pcVar2 = *(code **)(_buffer + 0x150);
    iVar3 = (this->m_spec).triangleCount;
    iVar1 = (this->m_spec).drawCallCount;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_staticIndexData,0);
    (*pcVar2)(0x8893,(long)(iVar3 * 3 * iVar1),pvVar5,0x88e4);
    (**(code **)(_buffer + 0x40))(0x8893,0);
    dVar4 = (**(code **)(_buffer + 0x800))();
    glu::checkError(dVar4,"Creating dynamic index buffer failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x1ce);
    this->m_batchedStaticIndexBuffer = local_28;
    (**(code **)(_buffer + 0x6c8))(1,&local_2c);
    (**(code **)(_buffer + 0x40))(0x8893,local_2c);
    pcVar2 = *(code **)(_buffer + 0x150);
    iVar3 = (this->m_spec).triangleCount;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_staticIndexData,0);
    (*pcVar2)(0x8893,(long)(iVar3 * 3),pvVar5,0x88e4);
    (**(code **)(_buffer + 0x40))(0x8893,0);
    dVar4 = (**(code **)(_buffer + 0x800))();
    glu::checkError(dVar4,"Creating dynamic index buffer failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x1da);
    this->m_unbatchedStaticIndexBuffer = local_2c;
  }
  else {
    for (buffer_1 = 0; (int)buffer_1 < (this->m_spec).drawCallCount; buffer_1 = buffer_1 + 1) {
      (**(code **)(_buffer + 0x6c8))(1,&buffer_2);
      (**(code **)(_buffer + 0x40))(0x8893,buffer_2);
      pcVar2 = *(code **)(_buffer + 0x150);
      iVar3 = (this->m_spec).triangleCount;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dynamicIndexData,
                          (long)(int)(buffer_1 * (this->m_spec).triangleCount * 3));
      (*pcVar2)(0x8893,(long)(iVar3 * 3),pvVar5,0x88e4);
      (**(code **)(_buffer + 0x40))(0x8893,0);
      dVar4 = (**(code **)(_buffer + 0x800))();
      glu::checkError(dVar4,"Creating dynamic index buffer failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                      ,0x1b4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_unbatchedDynamicIndexBuffers,&buffer_2);
    }
    (**(code **)(_buffer + 0x6c8))(1,&buffer_3);
    (**(code **)(_buffer + 0x40))(0x8893,buffer_3);
    pcVar2 = *(code **)(_buffer + 0x150);
    iVar3 = (this->m_spec).triangleCount;
    iVar1 = (this->m_spec).drawCallCount;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_dynamicIndexData,0);
    (*pcVar2)(0x8893,(long)(iVar3 * 3 * iVar1),pvVar5,0x88e4);
    (**(code **)(_buffer + 0x40))(0x8893,0);
    dVar4 = (**(code **)(_buffer + 0x800))();
    glu::checkError(dVar4,"Creating dynamic index buffer failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                    ,0x1c0);
    this->m_batchedDynamicIndexBuffer = buffer_3;
  }
  return;
}

Assistant:

void DrawCallBatchingTest::createIndexBuffer (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_spec.dynamicIndices)
	{
		for (int drawNdx = 0; drawNdx < m_spec.drawCallCount; drawNdx++)
		{
			GLuint buffer;

			gl.genBuffers(1, &buffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, 3 * m_spec.triangleCount, &(m_dynamicIndexData[drawNdx * m_spec.triangleCount * 3]), GL_STATIC_DRAW);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Creating dynamic index buffer failed");

			m_unbatchedDynamicIndexBuffers.push_back(buffer);
		}

		{
			GLuint buffer;

			gl.genBuffers(1, &buffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, 3 * m_spec.triangleCount * m_spec.drawCallCount, &(m_dynamicIndexData[0]), GL_STATIC_DRAW);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Creating dynamic index buffer failed");

			m_batchedDynamicIndexBuffer = buffer;
		}
	}
	else
	{
		{
			GLuint buffer;

			gl.genBuffers(1, &buffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, 3 * m_spec.triangleCount * m_spec.drawCallCount, &(m_staticIndexData[0]), GL_STATIC_DRAW);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Creating dynamic index buffer failed");

			m_batchedStaticIndexBuffer = buffer;
		}

		{
			GLuint buffer;

			gl.genBuffers(1, &buffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, 3 * m_spec.triangleCount, &(m_staticIndexData[0]), GL_STATIC_DRAW);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Creating dynamic index buffer failed");

			m_unbatchedStaticIndexBuffer = buffer;
		}
	}
}